

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

double __thiscall Comparator::score(Comparator *this,ScheduleHandle *s)

{
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pair<unsigned_long,_unsigned_long> pVar9;
  
  pVar9 = Schedule::analyze((s->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar1 = this->origin_time;
  uVar2 = this->limit;
  lVar3 = pVar9.first - uVar2;
  if (pVar9.first < uVar2 || lVar3 == 0) {
    dVar4 = 0.0;
  }
  else {
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  }
  lVar3 = pVar9.second - uVar1;
  auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar7._0_8_ = lVar3;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  return dVar4 * 0.6 +
         (((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) * 0.4;
}

Assistant:

double score(const ScheduleHandle &s) const {
        size_t peak_memory;
        uint64_t total_time;
        std::tie(peak_memory, total_time) = s->analyze();

        // Using exceeded ratio to compare, lower is better
        double exceeded_memory_ratio = peak_memory > limit ? (static_cast<double>(peak_memory - limit) / limit) : 0;
        double exceeded_time_ratio = static_cast<double>(total_time - origin_time) / origin_time;
        return MEMORY_FACTOR * exceeded_memory_ratio + TIME_FACTOR * exceeded_time_ratio;
    }